

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdBinop<unsigned_long,double>
          (Thread *this,BinopFunc<unsigned_long,_double> *f)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  Value VVar3;
  Value VVar4;
  double local_28;
  double local_20;
  
  VVar3 = Pop(this);
  VVar4 = Pop(this);
  local_28 = (double)VVar3.field_0.i64_;
  uVar1 = (*f)((double)VVar4.field_0.i64_,local_28);
  local_20 = VVar3.field_0._8_8_;
  uVar2 = (*f)(VVar4.field_0._8_8_,local_20);
  VVar3.field_0._8_8_ = uVar2;
  VVar3.field_0.i64_ = uVar1;
  Push(this,VVar3);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBinop(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto rhs = Pop<ST>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], rhs[i]);
  }
  Push(result);
  return RunResult::Ok;
}